

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

string * __thiscall
inja::DataNode::convert_dot_to_ptr_abi_cxx11_
          (string *__return_storage_ptr__,DataNode *this,string_view ptr_name)

{
  size_t sVar1;
  char *__first;
  char *pcVar2;
  string_view view;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  pcVar2 = (char *)ptr_name._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    view._M_str = pcVar2;
    view._M_len = (size_t)this;
    string_view::split(&local_50,view,'.');
    pcVar2 = local_50.second._M_str;
    this = (DataNode *)local_50.second._M_len;
    __first = local_50.first._M_str;
    sVar1 = local_50.first._M_len;
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    ::std::__cxx11::string::append<char_const*,void>
              ((string *)__return_storage_ptr__,__first,__first + sVar1);
  } while (this != (DataNode *)0x0);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert_dot_to_ptr(std::string_view ptr_name) {
    std::string result;
    do {
      std::string_view part;
      std::tie(part, ptr_name) = string_view::split(ptr_name, '.');
      result.push_back('/');
      result.append(part.begin(), part.end());
    } while (!ptr_name.empty());
    return result;
  }